

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_console_colour_impl.hpp
# Opt level: O3

void __thiscall Catch::anon_unknown_22::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  logic_error *this_00;
  undefined4 in_register_00000034;
  char *this_01;
  
  switch(_colourCode) {
  case None:
  case Headers:
    this_01 = "[0m";
    break;
  case Red:
    this_01 = "[0;31m";
    break;
  case Green:
    this_01 = "[0;32m";
    break;
  case Blue:
    this_01 = "[0:34m";
    break;
  case Cyan:
    this_01 = "[0;36m";
    break;
  case ReconstructedExpression:
    this_01 = "[0;33m";
    break;
  case Grey:
    this_01 = "[1;30m";
    break;
  default:
    return;
  case Bright:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"not a colour");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case BrightWhite:
    this_01 = "[1;37m";
    break;
  case BrightRed:
    this_01 = "[1;31m";
    break;
  case BrightGreen:
    this_01 = "[1;32m";
    break;
  case FileName:
    this_01 = "[0;37m";
  }
  setColour((PosixColourImpl *)this_01,(char *)CONCAT44(in_register_00000034,_colourCode));
  return;
}

Assistant:

virtual void use( Colour::Code _colourCode ) {
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0:34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );

                case Colour::Bright: throw std::logic_error( "not a colour" );
            }
        }